

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  buffer_appender<char> bVar11;
  char *pcVar12;
  char *pcVar13;
  buffer<char> *buf;
  long lVar14;
  int iVar15;
  _Alloc_hider _Var16;
  char *pcVar17;
  uint uVar18;
  undefined1 *puVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  undefined1 *puVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_2b0;
  undefined1 local_98 [8];
  char digits [40];
  string groups;
  
  grouping_impl<char>((string *)(digits + 0x20),(locale_ref)(this->locale).locale_);
  if (groups._M_dataplus._M_p == (pointer)0x0) {
    on_dec(this);
  }
  else {
    cVar8 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar8 != '\0') {
      puVar1 = &this->abs_value;
      uVar22 = (ulong)*puVar1;
      uVar10 = *(ulong *)((long)&this->abs_value + 8);
      auVar6 = (undefined1  [16])*puVar1;
      auVar29 = (undefined1  [16])*puVar1;
      uVar25 = 1;
      groups.field_2._8_8_ = this;
      if ((uVar22 < 10) <= uVar10) {
        uVar9 = 4;
        auVar28 = auVar29;
        do {
          uVar25 = uVar9;
          uVar27 = auVar28._8_8_;
          uVar24 = auVar28._0_8_;
          if (uVar27 == 0 && (ulong)(99 < uVar24) <= -uVar27) {
            uVar25 = uVar25 - 2;
            goto LAB_00243edc;
          }
          if (uVar27 == 0 && (ulong)(999 < uVar24) <= -uVar27) {
            uVar25 = uVar25 - 1;
            goto LAB_00243edc;
          }
          if (uVar27 < (uVar24 < 10000)) goto LAB_00243edc;
          auVar28 = __udivti3(uVar24,uVar27,10000,0);
          uVar9 = uVar25 + 4;
        } while (uVar27 != 0 || -uVar27 < (ulong)(99999 < uVar24));
        uVar25 = uVar25 + 1;
      }
LAB_00243edc:
      pcVar2 = groups._M_dataplus._M_p + digits._32_8_;
      pcVar13 = (char *)digits._32_8_;
      uVar9 = uVar25;
      uVar21 = uVar25;
      if (groups._M_dataplus._M_p != (pointer)0x0) {
        pcVar12 = (char *)digits._32_8_;
        _Var16._M_p = groups._M_dataplus._M_p;
        uVar20 = uVar25;
        do {
          cVar3 = *pcVar12;
          uVar18 = uVar9 - (int)cVar3;
          pcVar13 = pcVar12;
          uVar21 = uVar20;
          if ((uVar18 == 0 || (int)uVar9 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
          uVar20 = uVar20 + 1;
          pcVar12 = pcVar12 + 1;
          _Var16._M_p = _Var16._M_p + -1;
          pcVar13 = pcVar2;
          uVar9 = uVar18;
          uVar21 = uVar25 + (int)groups._M_dataplus._M_p;
        } while (_Var16._M_p != (pointer)0x0);
      }
      if (pcVar13 == pcVar2) {
        uVar21 = uVar21 + (int)(uVar9 - 1) / (int)pcVar2[-1];
      }
      iVar15 = 1;
      if ((uVar22 < 10) <= uVar10) {
        iVar26 = 4;
        auVar28 = auVar29;
        do {
          iVar15 = iVar26;
          uVar24 = auVar28._8_8_;
          uVar27 = auVar28._0_8_;
          if (uVar24 == 0 && (ulong)(99 < uVar27) <= -uVar24) {
            iVar15 = iVar15 + -2;
            goto LAB_00243fdb;
          }
          if (uVar24 == 0 && (ulong)(999 < uVar27) <= -uVar24) {
            iVar15 = iVar15 + -1;
            goto LAB_00243fdb;
          }
          if (uVar24 < (uVar27 < 10000)) goto LAB_00243fdb;
          auVar28 = __udivti3(uVar27,uVar24,10000,0);
          iVar26 = iVar15 + 4;
        } while (uVar24 != 0 || -uVar24 < (ulong)(99999 < uVar27));
        iVar15 = iVar15 + 1;
      }
LAB_00243fdb:
      if ((int)uVar25 < iVar15) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                    ,0x39c,"invalid digit count");
      }
      puVar19 = local_98 + (int)uVar25;
      puVar23 = puVar19;
      if ((uVar22 < 100) <= uVar10) {
        do {
          lVar14 = auVar29._8_8_;
          uVar22 = auVar29._0_8_;
          puVar19 = puVar23 + -2;
          auVar29 = __udivti3(uVar22,lVar14,100,0);
          *(undefined2 *)(puVar23 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar22 + auVar29._0_8_ * -100) * 2);
          puVar23 = puVar19;
          auVar6 = auVar29;
        } while (lVar14 != 0 || (ulong)-lVar14 < (ulong)(9999 < uVar22));
      }
      if (auVar6._8_8_ == 0 && (ulong)(9 < auVar6._0_8_) <= (ulong)-auVar6._8_8_) {
        puVar19[-1] = auVar6[0] | 0x30;
      }
      else {
        *(undefined2 *)(puVar19 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar6._0_8_ * 2)
        ;
      }
      uVar7 = groups.field_2._8_8_;
      local_2b0.super_buffer<char>.ptr_ = local_2b0.store_;
      local_2b0.super_buffer<char>.size_ = 0;
      local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002c6bb0;
      local_2b0.super_buffer<char>.capacity_ = 500;
      uVar21 = uVar21 + *(int *)(groups.field_2._8_8_ + 0x34);
      if (-1 < (int)uVar21) {
        uVar22 = (ulong)uVar21;
        if (500 < uVar21) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_2b0,uVar22);
        }
        pcVar2 = local_2b0.super_buffer<char>.ptr_;
        local_2b0.super_buffer<char>.size_ = local_2b0.super_buffer<char>.capacity_;
        if (uVar22 <= local_2b0.super_buffer<char>.capacity_) {
          local_2b0.super_buffer<char>.size_ = uVar22;
        }
        iVar26 = uVar25 + 1;
        puVar19 = local_98 + ((ulong)uVar25 - 1);
        iVar15 = 0;
        pcVar13 = (char *)digits._32_8_;
        pcVar12 = local_2b0.super_buffer<char>.ptr_ + uVar22;
        do {
          pcVar17 = pcVar12 + -1;
          pcVar12[-1] = *puVar19;
          cVar3 = *pcVar13;
          if ('\0' < cVar3) {
            iVar15 = iVar15 + 1;
            if ((cVar3 != '\x7f') && (iVar15 % (int)cVar3 == 0)) {
              pcVar17 = pcVar13 + 1;
              if (pcVar17 != groups._M_dataplus._M_p + digits._32_8_) {
                pcVar13 = pcVar17;
              }
              if (pcVar17 != groups._M_dataplus._M_p + digits._32_8_) {
                iVar15 = 0;
              }
              pcVar12[-2] = cVar8;
              pcVar17 = pcVar12 + -2;
            }
          }
          iVar26 = iVar26 + -1;
          puVar19 = puVar19 + -1;
          pcVar12 = pcVar17;
        } while (1 < iVar26);
        if (*(int *)(uVar7 + 0x34) != 0) {
          pcVar17[-1] = 0x2d;
        }
        piVar5 = *(int **)(uVar7 + 0x10);
        uVar10 = (ulong)*piVar5;
        if (-1 < (long)uVar10) {
          uVar24 = 0;
          if (uVar22 <= uVar10) {
            uVar24 = uVar10 - uVar22;
          }
          bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)uVar7;
          bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)(*(byte *)((long)piVar5 + 9) & 0xf));
          if (*(ulong *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar22 + *(byte *)((long)piVar5 + 0xe) * uVar24) {
            (*(code *)**(undefined8 **)
                        bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar10 = uVar24 >> (bVar4 & 0x3f);
          bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar11,uVar10,(fill_t<char> *)((long)piVar5 + 10));
          bVar11 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (pcVar2,pcVar2 + uVar22,bVar11);
          bVar11 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar11,uVar24 - uVar10,(fill_t<char> *)((long)piVar5 + 10));
          *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)groups.field_2._8_8_ =
               bVar11.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          local_2b0.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_002c6bb0;
          if (local_2b0.super_buffer<char>.ptr_ != local_2b0.store_) {
            operator_delete(local_2b0.super_buffer<char>.ptr_,local_2b0.super_buffer<char>.capacity_
                           );
          }
          goto LAB_00244240;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
    on_dec(this);
  }
LAB_00244240:
  if ((size_type *)digits._32_8_ != &groups._M_string_length) {
    operator_delete((void *)digits._32_8_,groups._M_string_length + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(to_unsigned(size));
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    using iterator = remove_reference_t<decltype(reserve(out, 0))>;
    auto data = buffer.data();
    out = write_padded<align::right>(out, specs, size, size, [=](iterator it) {
      return copy_str<Char>(data, data + size, it);
    });
  }